

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

UnicodeString *
icu_63::number::impl::PatternStringUtils::convertLocalized
          (UnicodeString *__return_storage_ptr__,UnicodeString *input,DecimalFormatSymbols *symbols,
          bool toLocalized,UErrorCode *status)

{
  bool bVar1;
  DecimalFormatSymbols *pDVar2;
  UBool UVar3;
  char16_t srcChar;
  int32_t iVar4;
  UnicodeString *pUVar5;
  long lVar6;
  long lVar7;
  UnicodeString *local_1040;
  UnicodeString *local_ef8;
  undefined1 local_ef0 [8];
  UnicodeString temp_1;
  UnicodeString_0_ *pair_1;
  UnicodeString_0_ *__end3_1;
  UnicodeString_0_ *__begin3_1;
  UnicodeString_0_ *__range3_1;
  undefined1 local_e88 [8];
  UnicodeString temp;
  UnicodeString_0_ *pair;
  UnicodeString_0_ *__end3;
  UnicodeString_0_ *__begin3;
  UnicodeString_0_ *__range3;
  int iStack_e20;
  UChar ch;
  int offset;
  int state;
  UnicodeString local_dd8;
  int local_d98;
  int local_d94;
  int32_t i_1;
  int i;
  UnicodeString local_d50;
  UnicodeString local_d10;
  UnicodeString local_cd0;
  UnicodeString local_c90;
  UnicodeString local_c50;
  UnicodeString local_c10;
  UnicodeString local_bd0;
  UnicodeString local_b90;
  UnicodeString local_b50;
  UnicodeString local_b10;
  uint local_acc;
  uint local_ac8;
  int localIdx;
  int standIdx;
  UnicodeString local_ab8 [22];
  UnicodeString aUStack_538 [20];
  undefined1 auStack_38 [16];
  UErrorCode *status_local;
  undefined8 uStack_20;
  bool toLocalized_local;
  DecimalFormatSymbols *symbols_local;
  UnicodeString *input_local;
  UnicodeString *result;
  
  local_ef8 = local_ab8;
  auStack_38._8_8_ = status;
  status_local._7_1_ = toLocalized;
  uStack_20 = symbols;
  symbols_local = (DecimalFormatSymbols *)input;
  input_local = __return_storage_ptr__;
  do {
    UnicodeString::UnicodeString(local_ef8);
    local_ef8 = local_ef8 + 1;
  } while (local_ef8 != (UnicodeString *)auStack_38);
  local_ac8 = (byte)~status_local._7_1_ & 1;
  local_acc = status_local._7_1_ & 1;
  UnicodeString::UnicodeString(&local_b10,L"%");
  UnicodeString::operator=(local_ab8 + (int)local_ac8,&local_b10);
  UnicodeString::~UnicodeString(&local_b10);
  pUVar5 = DecimalFormatSymbols::getConstSymbol((DecimalFormatSymbols *)uStack_20,kPercentSymbol);
  UnicodeString::operator=(local_ab8 + (int)local_acc,pUVar5);
  UnicodeString::UnicodeString(&local_b50,L"‰");
  UnicodeString::operator=(local_ab8 + (long)(int)local_ac8 + 2,&local_b50);
  UnicodeString::~UnicodeString(&local_b50);
  pUVar5 = DecimalFormatSymbols::getConstSymbol((DecimalFormatSymbols *)uStack_20,kPerMillSymbol);
  UnicodeString::operator=(local_ab8 + (long)(int)local_acc + 2,pUVar5);
  UnicodeString::UnicodeString(&local_b90,L".");
  UnicodeString::operator=(local_ab8 + (long)(int)local_ac8 + 4,&local_b90);
  UnicodeString::~UnicodeString(&local_b90);
  pUVar5 = DecimalFormatSymbols::getConstSymbol
                     ((DecimalFormatSymbols *)uStack_20,kDecimalSeparatorSymbol);
  UnicodeString::operator=(local_ab8 + (long)(int)local_acc + 4,pUVar5);
  UnicodeString::UnicodeString(&local_bd0,L",");
  UnicodeString::operator=(local_ab8 + (long)(int)local_ac8 + 6,&local_bd0);
  UnicodeString::~UnicodeString(&local_bd0);
  pUVar5 = DecimalFormatSymbols::getConstSymbol
                     ((DecimalFormatSymbols *)uStack_20,kGroupingSeparatorSymbol);
  UnicodeString::operator=(local_ab8 + (long)(int)local_acc + 6,pUVar5);
  UnicodeString::UnicodeString(&local_c10,L"-");
  UnicodeString::operator=(local_ab8 + (long)(int)local_ac8 + 8,&local_c10);
  UnicodeString::~UnicodeString(&local_c10);
  pUVar5 = DecimalFormatSymbols::getConstSymbol((DecimalFormatSymbols *)uStack_20,kMinusSignSymbol);
  UnicodeString::operator=(local_ab8 + (long)(int)local_acc + 8,pUVar5);
  UnicodeString::UnicodeString(&local_c50,L"+");
  UnicodeString::operator=(local_ab8 + (long)(int)local_ac8 + 10,&local_c50);
  UnicodeString::~UnicodeString(&local_c50);
  pUVar5 = DecimalFormatSymbols::getConstSymbol((DecimalFormatSymbols *)uStack_20,kPlusSignSymbol);
  UnicodeString::operator=(local_ab8 + (long)(int)local_acc + 10,pUVar5);
  UnicodeString::UnicodeString(&local_c90,L";");
  UnicodeString::operator=(local_ab8 + (long)(int)local_ac8 + 0xc,&local_c90);
  UnicodeString::~UnicodeString(&local_c90);
  pUVar5 = DecimalFormatSymbols::getConstSymbol
                     ((DecimalFormatSymbols *)uStack_20,kPatternSeparatorSymbol);
  UnicodeString::operator=(local_ab8 + (long)(int)local_acc + 0xc,pUVar5);
  UnicodeString::UnicodeString(&local_cd0,L"@");
  UnicodeString::operator=(local_ab8 + (long)(int)local_ac8 + 0xe,&local_cd0);
  UnicodeString::~UnicodeString(&local_cd0);
  pUVar5 = DecimalFormatSymbols::getConstSymbol
                     ((DecimalFormatSymbols *)uStack_20,kSignificantDigitSymbol);
  UnicodeString::operator=(local_ab8 + (long)(int)local_acc + 0xe,pUVar5);
  UnicodeString::UnicodeString(&local_d10,L"E");
  UnicodeString::operator=(local_ab8 + (long)(int)local_ac8 + 0x10,&local_d10);
  UnicodeString::~UnicodeString(&local_d10);
  pUVar5 = DecimalFormatSymbols::getConstSymbol
                     ((DecimalFormatSymbols *)uStack_20,kExponentialSymbol);
  UnicodeString::operator=(local_ab8 + (long)(int)local_acc + 0x10,pUVar5);
  UnicodeString::UnicodeString(&local_d50,L"*");
  UnicodeString::operator=(local_ab8 + (long)(int)local_ac8 + 0x12,&local_d50);
  UnicodeString::~UnicodeString(&local_d50);
  pUVar5 = DecimalFormatSymbols::getConstSymbol((DecimalFormatSymbols *)uStack_20,kPadEscapeSymbol);
  UnicodeString::operator=(local_ab8 + (long)(int)local_acc + 0x12,pUVar5);
  UnicodeString::UnicodeString((UnicodeString *)&i_1,L"#");
  UnicodeString::operator=(local_ab8 + (long)(int)local_ac8 + 0x14,(UnicodeString *)&i_1);
  UnicodeString::~UnicodeString((UnicodeString *)&i_1);
  pUVar5 = DecimalFormatSymbols::getConstSymbol((DecimalFormatSymbols *)uStack_20,kDigitSymbol);
  UnicodeString::operator=(local_ab8 + (long)(int)local_acc + 0x14,pUVar5);
  for (local_d94 = 0; local_d94 < 10; local_d94 = local_d94 + 1) {
    UnicodeString::operator=
              ((UnicodeString *)
               (auStack_38 + (long)(int)local_ac8 * 0x40 + (long)local_d94 * 0x80 + -0x500),
               local_d94 + 0x30);
    pUVar5 = DecimalFormatSymbols::getConstDigitSymbol((DecimalFormatSymbols *)uStack_20,local_d94);
    UnicodeString::operator=
              ((UnicodeString *)
               (auStack_38 + (long)(int)local_acc * 0x40 + (long)local_d94 * 0x80 + -0x500),pUVar5);
  }
  for (local_d98 = 0; local_d98 < 0x15; local_d98 = local_d98 + 1) {
    lVar6 = (long)local_d98;
    lVar7 = (long)(int)local_acc;
    UnicodeString::UnicodeString(&local_dd8,L'\'');
    UnicodeString::UnicodeString((UnicodeString *)&state,L'’');
    UnicodeString::findAndReplace(local_ab8 + lVar6 * 2 + lVar7,&local_dd8,(UnicodeString *)&state);
    UnicodeString::~UnicodeString((UnicodeString *)&state);
    UnicodeString::~UnicodeString(&local_dd8);
  }
  bVar1 = false;
  UnicodeString::UnicodeString(__return_storage_ptr__);
  iStack_e20 = 0;
  __range3._4_4_ = 0;
LAB_002fa63b:
  iVar4 = UnicodeString::length((UnicodeString *)symbols_local);
  if (__range3._4_4_ < iVar4) {
    srcChar = UnicodeString::charAt((UnicodeString *)symbols_local,__range3._4_4_);
    if (srcChar == L'\'') {
      if (iStack_e20 == 0) {
        UnicodeString::append(__return_storage_ptr__,L'\'');
        iStack_e20 = 1;
      }
      else if (iStack_e20 == 1) {
        UnicodeString::append(__return_storage_ptr__,L'\'');
        iStack_e20 = 0;
      }
      else if (iStack_e20 == 2) {
        iStack_e20 = 3;
      }
      else if (iStack_e20 == 3) {
        UnicodeString::append(__return_storage_ptr__,L'\'');
        UnicodeString::append(__return_storage_ptr__,L'\'');
        iStack_e20 = 1;
      }
      else if (iStack_e20 == 4) {
        iStack_e20 = 5;
      }
      else {
        UnicodeString::append(__return_storage_ptr__,L'\'');
        UnicodeString::append(__return_storage_ptr__,L'\'');
        iStack_e20 = 4;
      }
    }
    else if (((iStack_e20 == 0) || (iStack_e20 == 3)) || (iStack_e20 == 4)) {
      for (__end3 = (UnicodeString_0_ *)local_ab8; pDVar2 = symbols_local, __end3 != auStack_38;
          __end3 = __end3 + 0x80) {
        temp.fUnion._48_8_ = __end3;
        iVar4 = UnicodeString::length((UnicodeString *)__end3);
        UnicodeString::tempSubString
                  ((UnicodeString *)local_e88,(UnicodeString *)pDVar2,__range3._4_4_,iVar4);
        UVar3 = UnicodeString::operator==
                          ((UnicodeString *)local_e88,(UnicodeString *)temp.fUnion._48_8_);
        if (UVar3 == '\0') {
          __range3_1._4_4_ = 0;
        }
        else {
          iVar4 = UnicodeString::length((UnicodeString *)temp.fUnion._48_8_);
          __range3._4_4_ = iVar4 + -1 + __range3._4_4_;
          if ((iStack_e20 == 3) || (iStack_e20 == 4)) {
            UnicodeString::append(__return_storage_ptr__,L'\'');
            iStack_e20 = 0;
          }
          UnicodeString::append(__return_storage_ptr__,(UnicodeString *)(temp.fUnion._48_8_ + 0x40))
          ;
          __range3_1._4_4_ = 0xd;
        }
        UnicodeString::~UnicodeString((UnicodeString *)local_e88);
        if (__range3_1._4_4_ != 0) goto joined_r0x002fa96b;
      }
      for (__end3_1 = (UnicodeString_0_ *)local_ab8; pDVar2 = symbols_local, __end3_1 != auStack_38;
          __end3_1 = __end3_1 + 0x80) {
        temp_1.fUnion._48_8_ = __end3_1;
        iVar4 = UnicodeString::length((UnicodeString *)(__end3_1 + 0x40));
        UnicodeString::tempSubString
                  ((UnicodeString *)local_ef0,(UnicodeString *)pDVar2,__range3._4_4_,iVar4);
        UVar3 = UnicodeString::operator==
                          ((UnicodeString *)local_ef0,(UnicodeString *)(temp_1.fUnion._48_8_ + 0x40)
                          );
        if (UVar3 == '\0') {
          __range3_1._4_4_ = 0;
        }
        else {
          if (iStack_e20 == 0) {
            UnicodeString::append(__return_storage_ptr__,L'\'');
            iStack_e20 = 4;
          }
          UnicodeString::append(__return_storage_ptr__,srcChar);
          __range3_1._4_4_ = 0xd;
        }
        UnicodeString::~UnicodeString((UnicodeString *)local_ef0);
        if (__range3_1._4_4_ != 0) goto joined_r0x002fa96b;
      }
      if ((iStack_e20 == 3) || (iStack_e20 == 4)) {
        UnicodeString::append(__return_storage_ptr__,L'\'');
        iStack_e20 = 0;
      }
      UnicodeString::append(__return_storage_ptr__,srcChar);
    }
    else {
      UnicodeString::append(__return_storage_ptr__,srcChar);
      iStack_e20 = 2;
    }
    goto LAB_002fab88;
  }
  if ((iStack_e20 == 3) || (iStack_e20 == 4)) {
    UnicodeString::append(__return_storage_ptr__,L'\'');
    iStack_e20 = 0;
  }
  if (iStack_e20 != 0) {
    *(UErrorCode *)auStack_38._8_8_ = U_PATTERN_SYNTAX_ERROR;
  }
  bVar1 = true;
LAB_002fabef:
  if (!bVar1) {
    UnicodeString::~UnicodeString(__return_storage_ptr__);
  }
  local_1040 = (UnicodeString *)auStack_38;
  do {
    local_1040 = local_1040 + -1;
    UnicodeString::~UnicodeString(local_1040);
  } while (local_1040 != local_ab8);
  return __return_storage_ptr__;
joined_r0x002fa96b:
  if (__range3_1._4_4_ != 0xd) goto LAB_002fabef;
LAB_002fab88:
  __range3._4_4_ = __range3._4_4_ + 1;
  goto LAB_002fa63b;
}

Assistant:

UnicodeString
PatternStringUtils::convertLocalized(const UnicodeString& input, const DecimalFormatSymbols& symbols,
                                     bool toLocalized, UErrorCode& status) {
    // Construct a table of strings to be converted between localized and standard.
    static constexpr int32_t LEN = 21;
    UnicodeString table[LEN][2];
    int standIdx = toLocalized ? 0 : 1;
    int localIdx = toLocalized ? 1 : 0;
    table[0][standIdx] = u"%";
    table[0][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPercentSymbol);
    table[1][standIdx] = u"‰";
    table[1][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPerMillSymbol);
    table[2][standIdx] = u".";
    table[2][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kDecimalSeparatorSymbol);
    table[3][standIdx] = u",";
    table[3][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kGroupingSeparatorSymbol);
    table[4][standIdx] = u"-";
    table[4][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kMinusSignSymbol);
    table[5][standIdx] = u"+";
    table[5][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPlusSignSymbol);
    table[6][standIdx] = u";";
    table[6][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPatternSeparatorSymbol);
    table[7][standIdx] = u"@";
    table[7][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kSignificantDigitSymbol);
    table[8][standIdx] = u"E";
    table[8][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kExponentialSymbol);
    table[9][standIdx] = u"*";
    table[9][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPadEscapeSymbol);
    table[10][standIdx] = u"#";
    table[10][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kDigitSymbol);
    for (int i = 0; i < 10; i++) {
        table[11 + i][standIdx] = u'0' + i;
        table[11 + i][localIdx] = symbols.getConstDigitSymbol(i);
    }

    // Special case: quotes are NOT allowed to be in any localIdx strings.
    // Substitute them with '’' instead.
    for (int32_t i = 0; i < LEN; i++) {
        table[i][localIdx].findAndReplace(u'\'', u'’');
    }

    // Iterate through the string and convert.
    // State table:
    // 0 => base state
    // 1 => first char inside a quoted sequence in input and output string
    // 2 => inside a quoted sequence in input and output string
    // 3 => first char after a close quote in input string;
    // close quote still needs to be written to output string
    // 4 => base state in input string; inside quoted sequence in output string
    // 5 => first char inside a quoted sequence in input string;
    // inside quoted sequence in output string
    UnicodeString result;
    int state = 0;
    for (int offset = 0; offset < input.length(); offset++) {
        UChar ch = input.charAt(offset);

        // Handle a quote character (state shift)
        if (ch == u'\'') {
            if (state == 0) {
                result.append(u'\'');
                state = 1;
                continue;
            } else if (state == 1) {
                result.append(u'\'');
                state = 0;
                continue;
            } else if (state == 2) {
                state = 3;
                continue;
            } else if (state == 3) {
                result.append(u'\'');
                result.append(u'\'');
                state = 1;
                continue;
            } else if (state == 4) {
                state = 5;
                continue;
            } else {
                U_ASSERT(state == 5);
                result.append(u'\'');
                result.append(u'\'');
                state = 4;
                continue;
            }
        }

        if (state == 0 || state == 3 || state == 4) {
            for (auto& pair : table) {
                // Perform a greedy match on this symbol string
                UnicodeString temp = input.tempSubString(offset, pair[0].length());
                if (temp == pair[0]) {
                    // Skip ahead past this region for the next iteration
                    offset += pair[0].length() - 1;
                    if (state == 3 || state == 4) {
                        result.append(u'\'');
                        state = 0;
                    }
                    result.append(pair[1]);
                    goto continue_outer;
                }
            }
            // No replacement found. Check if a special quote is necessary
            for (auto& pair : table) {
                UnicodeString temp = input.tempSubString(offset, pair[1].length());
                if (temp == pair[1]) {
                    if (state == 0) {
                        result.append(u'\'');
                        state = 4;
                    }
                    result.append(ch);
                    goto continue_outer;
                }
            }
            // Still nothing. Copy the char verbatim. (Add a close quote if necessary)
            if (state == 3 || state == 4) {
                result.append(u'\'');
                state = 0;
            }
            result.append(ch);
        } else {
            U_ASSERT(state == 1 || state == 2 || state == 5);
            result.append(ch);
            state = 2;
        }
        continue_outer:;
    }
    // Resolve final quotes
    if (state == 3 || state == 4) {
        result.append(u'\'');
        state = 0;
    }
    if (state != 0) {
        // Malformed localized pattern: unterminated quote
        status = U_PATTERN_SYNTAX_ERROR;
    }
    return result;
}